

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

void png_ascii_from_fp(png_const_structrp png_ptr,png_charp ascii,png_size_t size,double fp,
                      uint precision)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char cVar9;
  char *pcVar10;
  bool bVar11;
  double dVar12;
  uint local_7c;
  double d;
  double local_70;
  png_const_structrp local_68;
  ulong local_60;
  char cStack_53;
  char exponent [10];
  
  uVar3 = 0x10;
  if (precision < 0x10) {
    uVar3 = precision;
  }
  uVar5 = 0xf;
  if (precision != 0) {
    uVar5 = (ulong)uVar3;
  }
  if ((int)uVar5 + 5 <= size) {
    if (fp < 0.0) {
      fp = -fp;
      *ascii = '-';
      ascii = ascii + 1;
      size = size - 1;
    }
    if ((fp < 2.2250738585072014e-308) || (1.79769313486232e+308 < fp)) {
      if (fp < 2.2250738585072014e-308) {
        ascii[0] = '0';
        ascii[1] = '\0';
      }
      else {
        builtin_strncpy(ascii,"inf",4);
      }
    }
    else {
      local_68 = png_ptr;
      local_60 = uVar5;
      frexp(fp,(int *)&local_7c);
      iVar6 = (int)(local_7c * 0x4d) >> 8;
      dVar12 = png_pow10(iVar6);
      do {
        iVar7 = iVar6;
        local_70 = dVar12;
        if ((2.2250738585072014e-308 <= dVar12) && (fp <= dVar12)) break;
        dVar12 = png_pow10(iVar7 + 1);
        iVar6 = iVar7 + 1;
      } while (dVar12 <= 1.79769313486232e+308);
      uVar5 = local_60;
      iVar6 = 0;
      for (dVar12 = fp / local_70; 1.0 <= dVar12; dVar12 = dVar12 / 10.0) {
        iVar6 = iVar6 + -1;
      }
      local_7c = iVar7 - iVar6;
      uVar3 = 0;
      iVar1 = 0;
      iVar8 = iVar1;
      if (0xfffffffd < local_7c) {
        iVar1 = iVar6 - iVar7;
        local_7c = 0;
        iVar8 = iVar1;
      }
      do {
        if (iVar1 + uVar3 + 1 < (uint)(iVar8 + (int)uVar5)) {
          dVar12 = modf(dVar12 * 10.0,&d);
LAB_00277bd1:
          pcVar10 = ascii;
          iVar6 = iVar1;
          if ((d != 0.0) || (NAN(d))) goto LAB_00277c1d;
          iVar1 = iVar1 + 1;
          iVar8 = iVar8 + (uint)(uVar3 == 0);
        }
        else {
          d = floor(dVar12 * 10.0 + 0.5);
          dVar12 = 0.0;
          if (d <= 9.0) goto LAB_00277bd1;
          uVar2 = local_7c;
          if (iVar1 == 0) {
            while ((uVar3 != 0 && (9.0 < d))) {
              pcVar10 = ascii + -1;
              cVar9 = ascii[-1];
              if (uVar2 == 0xffffffff) {
                if (cVar9 == '.') {
                  cVar9 = ascii[-2];
                  pcVar10 = ascii + -2;
                  size = size + 1;
                  local_7c = 1;
                  uVar2 = 1;
                }
                else {
                  uVar2 = 0xffffffff;
                }
              }
              else {
                local_7c = uVar2 + 1;
                uVar2 = local_7c;
              }
              ascii = pcVar10;
              uVar3 = uVar3 - 1;
              d = (double)(cVar9 + -0x2f);
            }
            if (d <= 9.0) goto LAB_00277bd1;
            if (uVar2 == 0xffffffff) {
              pcVar10 = ascii + -1;
              if (ascii[-1] == '.') {
                size = size + 1;
                local_7c = 1;
              }
            }
            else {
              local_7c = uVar2 + 1;
              pcVar10 = ascii;
            }
            d = 1.0;
            dVar12 = 0.0;
            iVar1 = 0;
            iVar6 = iVar1;
          }
          else {
            iVar1 = iVar1 + -1;
            d = 1.0;
            iVar8 = iVar8 - (uint)(uVar3 == 0);
            pcVar10 = ascii;
            iVar6 = iVar1;
          }
LAB_00277c1d:
          while (bVar11 = iVar1 != 0, iVar1 = iVar1 + -1, bVar11) {
            if (local_7c != 0xffffffff) {
              if (local_7c == 0) {
                *pcVar10 = '.';
                pcVar10 = pcVar10 + 1;
                size = size - 1;
              }
              local_7c = local_7c - 1;
            }
            *pcVar10 = '0';
            pcVar10 = pcVar10 + 1;
          }
          if (local_7c != 0xffffffff) {
            if (local_7c == 0) {
              *pcVar10 = '.';
              pcVar10 = pcVar10 + 1;
              size = size - 1;
            }
            local_7c = local_7c - 1;
          }
          *pcVar10 = (char)(int)d + '0';
          ascii = pcVar10 + 1;
          uVar3 = (uVar3 - iVar8) + iVar6 + 1;
          iVar1 = 0;
          iVar8 = 0;
        }
      } while ((uVar3 + iVar1 < (uint)(iVar8 + (int)uVar5)) && (2.2250738585072014e-308 < dVar12));
      if (local_7c + 1 < 4) {
        while (0 < (int)local_7c) {
          *ascii = '0';
          ascii = ascii + 1;
          local_7c = local_7c - 1;
        }
      }
      else {
        *ascii = 'E';
        uVar5 = size + ~(ulong)uVar3;
        if ((int)local_7c < 0) {
          ascii[1] = '-';
          ascii = ascii + 2;
          uVar5 = uVar5 - 1;
          uVar3 = -local_7c;
        }
        else {
          ascii = ascii + 1;
          uVar3 = local_7c;
        }
        uVar4 = 0;
        for (; uVar3 != 0; uVar3 = uVar3 / 10) {
          exponent[uVar4] = (byte)((ulong)uVar3 % 10) | 0x30;
          uVar4 = (ulong)((int)uVar4 + 1);
        }
        png_ptr = local_68;
        if (uVar5 <= uVar4) goto LAB_00277d44;
        while (uVar4 != 0) {
          *ascii = exponent[uVar4 - 1];
          ascii = ascii + 1;
          uVar4 = uVar4 - 1;
        }
      }
      *ascii = '\0';
    }
    return;
  }
LAB_00277d44:
  png_error(png_ptr,"ASCII conversion buffer too small");
}

Assistant:

void /* PRIVATE */
png_ascii_from_fp(png_const_structrp png_ptr, png_charp ascii, png_size_t size,
    double fp, unsigned int precision)
{
   /* We use standard functions from math.h, but not printf because
    * that would require stdio.  The caller must supply a buffer of
    * sufficient size or we will png_error.  The tests on size and
    * the space in ascii[] consumed are indicated below.
    */
   if (precision < 1)
      precision = DBL_DIG;

   /* Enforce the limit of the implementation precision too. */
   if (precision > DBL_DIG+1)
      precision = DBL_DIG+1;

   /* Basic sanity checks */
   if (size >= precision+5) /* See the requirements below. */
   {
      if (fp < 0)
      {
         fp = -fp;
         *ascii++ = 45; /* '-'  PLUS 1 TOTAL 1 */
         --size;
      }

      if (fp >= DBL_MIN && fp <= DBL_MAX)
      {
         int exp_b10;   /* A base 10 exponent */
         double base;   /* 10^exp_b10 */

         /* First extract a base 10 exponent of the number,
          * the calculation below rounds down when converting
          * from base 2 to base 10 (multiply by log10(2) -
          * 0.3010, but 77/256 is 0.3008, so exp_b10 needs to
          * be increased.  Note that the arithmetic shift
          * performs a floor() unlike C arithmetic - using a
          * C multiply would break the following for negative
          * exponents.
          */
         (void)frexp(fp, &exp_b10); /* exponent to base 2 */

         exp_b10 = (exp_b10 * 77) >> 8; /* <= exponent to base 10 */

         /* Avoid underflow here. */
         base = png_pow10(exp_b10); /* May underflow */

         while (base < DBL_MIN || base < fp)
         {
            /* And this may overflow. */
            double test = png_pow10(exp_b10+1);

            if (test <= DBL_MAX)
            {
               ++exp_b10; base = test;
            }

            else
               break;
         }

         /* Normalize fp and correct exp_b10, after this fp is in the
          * range [.1,1) and exp_b10 is both the exponent and the digit
          * *before* which the decimal point should be inserted
          * (starting with 0 for the first digit).  Note that this
          * works even if 10^exp_b10 is out of range because of the
          * test on DBL_MAX above.
          */
         fp /= base;
         while (fp >= 1)
         {
            fp /= 10; ++exp_b10;
         }

         /* Because of the code above fp may, at this point, be
          * less than .1, this is ok because the code below can
          * handle the leading zeros this generates, so no attempt
          * is made to correct that here.
          */

         {
            unsigned int czero, clead, cdigits;
            char exponent[10];

            /* Allow up to two leading zeros - this will not lengthen
             * the number compared to using E-n.
             */
            if (exp_b10 < 0 && exp_b10 > -3) /* PLUS 3 TOTAL 4 */
            {
               czero = 0U-exp_b10; /* PLUS 2 digits: TOTAL 3 */
               exp_b10 = 0;      /* Dot added below before first output. */
            }
            else
               czero = 0;    /* No zeros to add */

            /* Generate the digit list, stripping trailing zeros and
             * inserting a '.' before a digit if the exponent is 0.
             */
            clead = czero; /* Count of leading zeros */
            cdigits = 0;   /* Count of digits in list. */

            do
            {
               double d;

               fp *= 10;
               /* Use modf here, not floor and subtract, so that
                * the separation is done in one step.  At the end
                * of the loop don't break the number into parts so
                * that the final digit is rounded.
                */
               if (cdigits+czero+1 < precision+clead)
                  fp = modf(fp, &d);

               else
               {
                  d = floor(fp + .5);

                  if (d > 9)
                  {
                     /* Rounding up to 10, handle that here. */
                     if (czero > 0)
                     {
                        --czero; d = 1;
                        if (cdigits == 0) --clead;
                     }
                     else
                     {
                        while (cdigits > 0 && d > 9)
                        {
                           int ch = *--ascii;

                           if (exp_b10 != (-1))
                              ++exp_b10;

                           else if (ch == 46)
                           {
                              ch = *--ascii; ++size;
                              /* Advance exp_b10 to '1', so that the
                               * decimal point happens after the
                               * previous digit.
                               */
                              exp_b10 = 1;
                           }

                           --cdigits;
                           d = ch - 47;  /* I.e. 1+(ch-48) */
                        }

                        /* Did we reach the beginning? If so adjust the
                         * exponent but take into account the leading
                         * decimal point.
                         */
                        if (d > 9)  /* cdigits == 0 */
                        {
                           if (exp_b10 == (-1))
                           {
                              /* Leading decimal point (plus zeros?), if
                               * we lose the decimal point here it must
                               * be reentered below.
                               */
                              int ch = *--ascii;

                              if (ch == 46)
                              {
                                 ++size; exp_b10 = 1;
                              }

                              /* Else lost a leading zero, so 'exp_b10' is
                               * still ok at (-1)
                               */
                           }
                           else
                              ++exp_b10;

                           /* In all cases we output a '1' */
                           d = 1;
                        }
                     }
                  }
                  fp = 0; /* Guarantees termination below. */
               }

               if (d == 0)
               {
                  ++czero;
                  if (cdigits == 0) ++clead;
               }
               else
               {
                  /* Included embedded zeros in the digit count. */
                  cdigits += czero - clead;
                  clead = 0;

                  while (czero > 0)
                  {
                     /* exp_b10 == (-1) means we just output the decimal
                      * place - after the DP don't adjust 'exp_b10' any
                      * more!
                      */
                     if (exp_b10 != (-1))
                     {
                        if (exp_b10 == 0)
                        {
                           *ascii++ = 46; --size;
                        }
                        /* PLUS 1: TOTAL 4 */
                        --exp_b10;
                     }
                     *ascii++ = 48; --czero;
                  }

                  if (exp_b10 != (-1))
                  {
                     if (exp_b10 == 0)
                     {
                        *ascii++ = 46; --size; /* counted above */
                     }

                     --exp_b10;
                  }
                  *ascii++ = (char)(48 + (int)d); ++cdigits;
               }
            }
            while (cdigits+czero < precision+clead && fp > DBL_MIN);

            /* The total output count (max) is now 4+precision */

            /* Check for an exponent, if we don't need one we are
             * done and just need to terminate the string.  At
             * this point exp_b10==(-1) is effectively a flag - it got
             * to '-1' because of the decrement after outputting
             * the decimal point above (the exponent required is
             * *not* -1!)
             */
            if (exp_b10 >= (-1) && exp_b10 <= 2)
            {
               /* The following only happens if we didn't output the
                * leading zeros above for negative exponent, so this
                * doesn't add to the digit requirement.  Note that the
                * two zeros here can only be output if the two leading
                * zeros were *not* output, so this doesn't increase
                * the output count.
                */
               while (exp_b10-- > 0) *ascii++ = 48;

               *ascii = 0;

               /* Total buffer requirement (including the '\0') is
                * 5+precision - see check at the start.
                */
               return;
            }

            /* Here if an exponent is required, adjust size for
             * the digits we output but did not count.  The total
             * digit output here so far is at most 1+precision - no
             * decimal point and no leading or trailing zeros have
             * been output.
             */
            size -= cdigits;

            *ascii++ = 69; --size;    /* 'E': PLUS 1 TOTAL 2+precision */

            /* The following use of an unsigned temporary avoids ambiguities in
             * the signed arithmetic on exp_b10 and permits GCC at least to do
             * better optimization.
             */
            {
               unsigned int uexp_b10;

               if (exp_b10 < 0)
               {
                  *ascii++ = 45; --size; /* '-': PLUS 1 TOTAL 3+precision */
                  uexp_b10 = 0U-exp_b10;
               }

               else
                  uexp_b10 = 0U+exp_b10;

               cdigits = 0;

               while (uexp_b10 > 0)
               {
                  exponent[cdigits++] = (char)(48 + uexp_b10 % 10);
                  uexp_b10 /= 10;
               }
            }

            /* Need another size check here for the exponent digits, so
             * this need not be considered above.
             */
            if (size > cdigits)
            {
               while (cdigits > 0) *ascii++ = exponent[--cdigits];

               *ascii = 0;

               return;
            }
         }
      }
      else if (!(fp >= DBL_MIN))
      {
         *ascii++ = 48; /* '0' */
         *ascii = 0;
         return;
      }
      else
      {
         *ascii++ = 105; /* 'i' */
         *ascii++ = 110; /* 'n' */
         *ascii++ = 102; /* 'f' */
         *ascii = 0;
         return;
      }
   }

   /* Here on buffer too small. */
   png_error(png_ptr, "ASCII conversion buffer too small");
}